

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.h
# Opt level: O0

void __thiscall wabt::ReturnCallIndirectExpr::~ReturnCallIndirectExpr(ReturnCallIndirectExpr *this)

{
  ReturnCallIndirectExpr *this_local;
  
  ~ReturnCallIndirectExpr(this);
  operator_delete(this);
  return;
}

Assistant:

explicit ReturnCallIndirectExpr(const Location &loc = Location())
      : ExprMixin<ExprType::ReturnCallIndirect>(loc) {}